

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stretch.cpp
# Opt level: O0

void doStretch(MidiFile *midifile,double bars,double duration)

{
  int iVar1;
  int *piVar2;
  MidiEventList *this;
  MidiEvent *this_00;
  double dVar3;
  double tempo;
  MidiEvent *event;
  int e;
  MidiEventList *track;
  int t;
  double tick_mult;
  int local_28;
  int local_24;
  int new_ppqn;
  int ppqn;
  double duration_local;
  double bars_local;
  MidiFile *midifile_local;
  
  _new_ppqn = duration;
  duration_local = bars;
  bars_local = (double)midifile;
  local_24 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  tick_mult._4_4_ = 0x6000;
  piVar2 = std::max<int>((int *)((long)&tick_mult + 4),&local_24);
  local_28 = *piVar2;
  smf::MidiFile::setTicksPerQuarterNote((MidiFile *)bars_local,local_28);
  dVar3 = ((double)local_28 / (double)local_24) / duration_local;
  track._4_4_ = 0;
  while( true ) {
    iVar1 = smf::MidiFile::size((MidiFile *)bars_local);
    if (iVar1 <= track._4_4_) break;
    this = smf::MidiFile::operator[]((MidiFile *)bars_local,track._4_4_);
    event._4_4_ = 0;
    while( true ) {
      iVar1 = smf::MidiEventList::size(this);
      if (iVar1 <= event._4_4_) break;
      this_00 = smf::MidiEventList::operator[](this,event._4_4_);
      this_00->tick = (int)((double)this_00->tick * dVar3) * this_00->tick;
      iVar1 = smf::MidiMessage::getMetaType(&this_00->super_MidiMessage);
      if (iVar1 == 0x51) {
        iVar1 = smf::MidiMessage::getTempoMicroseconds(&this_00->super_MidiMessage);
        smf::MidiMessage::setTempoMicroseconds
                  (&this_00->super_MidiMessage,(int)(_new_ppqn * duration_local * (double)iVar1));
      }
      event._4_4_ = event._4_4_ + 1;
    }
    track._4_4_ = track._4_4_ + 1;
  }
  return;
}

Assistant:

void doStretch(MidiFile& midifile, double bars, double duration) {
    int ppqn = midifile.getTicksPerQuarterNote();
    int new_ppqn = max( 24576, ppqn );
    midifile.setTicksPerQuarterNote( new_ppqn );
    double tick_mult = (double)new_ppqn / (double)ppqn;
    tick_mult /= bars;

    for (int t = 0; t < midifile.size(); ++t) {
	MidiEventList &track = midifile[t];
	for (int e = 0; e < track.size(); ++e) {
	    MidiEvent &event = track[e];
	    event.tick *= (int)(event.tick * tick_mult);
	    if (event.getMetaType() == 0x51) {
		double tempo = event.getTempoMicroseconds();
		tempo *= bars;
		tempo *= duration;
		event.setTempoMicroseconds( (int)tempo );
	    }
	}
    }
}